

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockSymbols.cpp
# Opt level: O0

StatementBlockSymbol *
slang::ast::StatementBlockSymbol::fromSyntax(Scope *scope,ConditionalStatementSyntax *syntax)

{
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  bool bVar1;
  Compilation *this;
  ConditionalPatternSyntax *node;
  StatementSyntax *pSVar2;
  StatementBlockSymbol *pSVar3;
  Scope *in_RDI;
  span<const_slang::ast::StatementBlockSymbol_*const,_18446744073709551615UL> sVar4;
  StatementBlockSymbol *block;
  StatementBlockSymbol *block_1;
  ConditionalPatternSyntax *cond;
  iterator __end2;
  iterator __begin2;
  SeparatedSyntaxList<slang::syntax::ConditionalPatternSyntax> *__range2;
  StatementBlockSymbol *curr;
  StatementBlockSymbol *first;
  Compilation *comp;
  Symbol *in_stack_fffffffffffffec8;
  Compilation *in_stack_fffffffffffffed0;
  Compilation *__range;
  VariableLifetime *in_stack_fffffffffffffee8;
  StatementBlockKind *in_stack_fffffffffffffef0;
  Scope *in_stack_fffffffffffffef8;
  Symbol *in_stack_ffffffffffffff00;
  Compilation *in_stack_ffffffffffffff08;
  __extent_storage<18446744073709551615UL> in_stack_ffffffffffffff10;
  pointer local_e8;
  __extent_storage<18446744073709551615UL> local_e0;
  Token local_c0;
  SourceLocation local_b0;
  basic_string_view<char,_std::char_traits<char>_> local_a8;
  StatementBlockSymbol *local_98;
  undefined4 local_90;
  undefined4 in_stack_ffffffffffffff74;
  undefined1 labelHandled;
  Token in_stack_ffffffffffffff78;
  basic_string_view<char,_std::char_traits<char>_> in_stack_ffffffffffffff90;
  BlockStatementSyntax *syntax_01;
  StatementBlockSymbol *in_stack_ffffffffffffffa0;
  StatementBlockSymbol *local_20;
  
  this = Scope::getCompilation(in_RDI);
  local_20 = (StatementBlockSymbol *)0x0;
  not_null<slang::syntax::ConditionalPredicateSyntax_*>::operator->
            ((not_null<slang::syntax::ConditionalPredicateSyntax_*> *)0x31db98);
  slang::syntax::SeparatedSyntaxList<slang::syntax::ConditionalPatternSyntax>::begin
            ((SeparatedSyntaxList<slang::syntax::ConditionalPatternSyntax> *)0x31dbb1);
  slang::syntax::SeparatedSyntaxList<slang::syntax::ConditionalPatternSyntax>::end
            ((SeparatedSyntaxList<slang::syntax::ConditionalPatternSyntax> *)
             in_stack_fffffffffffffed0);
  while( true ) {
    bVar1 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::ConditionalPatternSyntax>::iterator_base<slang::syntax::ConditionalPatternSyntax_*>_>
                      ((self_type *)in_stack_fffffffffffffed0,
                       (iterator_base<slang::syntax::ConditionalPatternSyntax_*> *)
                       in_stack_fffffffffffffec8);
    labelHandled = (undefined1)((uint)in_stack_ffffffffffffff74 >> 0x18);
    syntax_01 = (BlockStatementSyntax *)in_stack_ffffffffffffff90._M_str;
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    node = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ConditionalPatternSyntax>::iterator_base<slang::syntax::ConditionalPatternSyntax_*>,_false>
           ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ConditionalPatternSyntax>::iterator_base<slang::syntax::ConditionalPatternSyntax_*>,_false>
                        *)0x31dc0b);
    pSVar3 = local_20;
    if (node->matchesClause != (MatchesClauseSyntax *)0x0) {
      in_stack_ffffffffffffff08 = this;
      in_stack_ffffffffffffff10._M_extent_value = (size_t)this;
      in_stack_ffffffffffffff90 =
           sv((char *)in_stack_fffffffffffffed0,(size_t)in_stack_fffffffffffffec8);
      in_stack_ffffffffffffff78 =
           slang::syntax::SyntaxNode::getFirstToken((SyntaxNode *)in_stack_ffffffffffffff00);
      parsing::Token::location((Token *)&stack0xffffffffffffff78);
      in_stack_ffffffffffffff74 = 0;
      local_90 = 0;
      in_stack_ffffffffffffffa0 =
           BumpAllocator::
           emplace<slang::ast::StatementBlockSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::StatementBlockKind,slang::ast::VariableLifetime>
                     ((BumpAllocator *)in_stack_ffffffffffffff10._M_extent_value,
                      in_stack_ffffffffffffff08,
                      (basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff00,
                      (SourceLocation *)in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                      in_stack_fffffffffffffee8);
      Scope::setNeedElaboration((Scope *)0x31dcf4);
      Symbol::setSyntax(&in_stack_ffffffffffffffa0->super_Symbol,&node->super_SyntaxNode);
      pSVar3 = in_stack_ffffffffffffffa0;
      if (local_20 != (StatementBlockSymbol *)0x0) {
        Scope::addMember((Scope *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
        pSVar3 = local_20;
      }
    }
    local_20 = pSVar3;
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ConditionalPatternSyntax>::iterator_base<slang::syntax::ConditionalPatternSyntax_*>,_false>
    ::
    operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::ConditionalPatternSyntax>::iterator_base<slang::syntax::ConditionalPatternSyntax_*>_>
              ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ConditionalPatternSyntax>::iterator_base<slang::syntax::ConditionalPatternSyntax_*>,_false>
                *)in_stack_fffffffffffffed0);
  }
  pSVar2 = not_null<slang::syntax::StatementSyntax_*>::operator->
                     ((not_null<slang::syntax::StatementSyntax_*> *)0x31dd81);
  if (((pSVar2->super_SyntaxNode).kind == SequentialBlockStatement) ||
     (pSVar2 = not_null<slang::syntax::StatementSyntax_*>::operator->
                         ((not_null<slang::syntax::StatementSyntax_*> *)0x31dd9d),
     (pSVar2->super_SyntaxNode).kind == ParallelBlockStatement)) {
    this = in_stack_fffffffffffffed0;
    pSVar2 = not_null<slang::syntax::StatementSyntax_*>::operator->
                       ((not_null<slang::syntax::StatementSyntax_*> *)0x31ddc6);
    slang::syntax::SyntaxNode::as<slang::syntax::BlockStatementSyntax>(&pSVar2->super_SyntaxNode);
    local_98 = fromSyntax((Scope *)in_stack_ffffffffffffffa0,syntax_01);
  }
  else {
    __range = this;
    local_a8 = sv((char *)this,(size_t)in_stack_fffffffffffffec8);
    not_null<slang::syntax::StatementSyntax_*>::operator->
              ((not_null<slang::syntax::StatementSyntax_*> *)0x31de36);
    local_c0 = slang::syntax::SyntaxNode::getFirstToken((SyntaxNode *)in_stack_ffffffffffffff00);
    local_b0 = parsing::Token::location(&local_c0);
    pSVar3 = BumpAllocator::
             emplace<slang::ast::StatementBlockSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::StatementBlockKind,slang::ast::VariableLifetime>
                       ((BumpAllocator *)in_stack_ffffffffffffff10._M_extent_value,
                        in_stack_ffffffffffffff08,
                        (basic_string_view<char,_std::char_traits<char>_> *)
                        in_stack_ffffffffffffff00,(SourceLocation *)in_stack_fffffffffffffef8,
                        in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    local_98 = pSVar3;
    pSVar2 = not_null<slang::syntax::StatementSyntax_*>::operator*
                       ((not_null<slang::syntax::StatementSyntax_*> *)0x31debf);
    Symbol::setSyntax(&pSVar3->super_Symbol,&pSVar2->super_SyntaxNode);
    std::span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>::
    span<const_slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>_&>
              ((span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> *)
               pSVar3,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)__range);
    syntax_00._M_extent._M_extent_value = in_stack_ffffffffffffff10._M_extent_value;
    syntax_00._M_ptr = (pointer)in_stack_ffffffffffffff08;
    Symbol::setAttributes(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,syntax_00);
    not_null<slang::syntax::StatementSyntax_*>::operator*
              ((not_null<slang::syntax::StatementSyntax_*> *)0x31df3a);
    sVar4 = Statement::createAndAddBlockItems
                      ((Scope *)in_stack_ffffffffffffff78.info,in_stack_ffffffffffffff78._0_8_,
                       (bool)labelHandled);
    local_e8 = sVar4._M_ptr;
    (local_98->blocks)._M_ptr = local_e8;
    local_e0 = sVar4._M_extent._M_extent_value;
    (local_98->blocks)._M_extent._M_extent_value = local_e0._M_extent_value;
  }
  Scope::addMember((Scope *)this,in_stack_fffffffffffffec8);
  return local_20;
}

Assistant:

StatementBlockSymbol& StatementBlockSymbol::fromSyntax(const Scope& scope,
                                                       const ConditionalStatementSyntax& syntax) {
    // Each matches clause gets its own block with its own variables.
    auto& comp = scope.getCompilation();
    StatementBlockSymbol* first = nullptr;
    StatementBlockSymbol* curr = nullptr;

    for (auto cond : syntax.predicate->conditions) {
        if (cond->matchesClause) {
            auto block = comp.emplace<StatementBlockSymbol>(
                comp, ""sv, cond->matchesClause->getFirstToken().location(),
                StatementBlockKind::Sequential, VariableLifetime::Automatic);

            // Each block needs elaboration to collect pattern variables.
            block->setNeedElaboration();
            block->setSyntax(*cond);

            if (!first) {
                first = curr = block;
            }
            else {
                curr->addMember(*block);
                curr = block;
            }
        }
    }

    // The most nested block gets the actual statement items. If it's already a sequential
    // block we can just use that, otherwise we need to fabricate one.
    StatementBlockSymbol* block;
    if (syntax.statement->kind == SyntaxKind::SequentialBlockStatement ||
        syntax.statement->kind == SyntaxKind::ParallelBlockStatement) {

        block = &StatementBlockSymbol::fromSyntax(scope,
                                                  syntax.statement->as<BlockStatementSyntax>());
    }
    else {
        block = comp.emplace<StatementBlockSymbol>(comp, ""sv,
                                                   syntax.statement->getFirstToken().location(),
                                                   StatementBlockKind::Sequential,
                                                   VariableLifetime::Automatic);
        block->setSyntax(*syntax.statement);
        block->setAttributes(scope, syntax.attributes);
        block->blocks = Statement::createAndAddBlockItems(*block, *syntax.statement,
                                                          /* labelHandled */ false);
    }

    SLANG_ASSERT(curr && first);
    curr->addMember(*block);

    return *first;
}